

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_tests.cpp
# Opt level: O0

void __thiscall
iu_UnitStringTest_x_iutest_x_OwnStricmp_Test::Body
          (iu_UnitStringTest_x_iutest_x_OwnStricmp_Test *this)

{
  bool bVar1;
  char *pcVar2;
  int *val2;
  type **in_stack_fffffffffffff3a8;
  AssertionHelper local_b98;
  Fixed local_b68;
  int local_9e0;
  char local_9dc [4];
  undefined1 local_9d8 [8];
  AssertionResult iutest_ar_5;
  Fixed local_980;
  int local_7f8;
  char local_7f4 [4];
  undefined1 local_7f0 [8];
  AssertionResult iutest_ar_4;
  Fixed local_798;
  int local_610;
  char local_60c [4];
  undefined1 local_608 [8];
  AssertionResult iutest_ar_3;
  Fixed local_5b0;
  int local_428;
  char local_424 [4];
  undefined1 local_420 [8];
  AssertionResult iutest_ar_2;
  Fixed local_3c8;
  int local_240;
  char local_23c [4];
  undefined1 local_238 [8];
  AssertionResult iutest_ar_1;
  Fixed local_1e0;
  int local_48;
  char local_44 [4];
  undefined1 local_40 [8];
  AssertionResult iutest_ar;
  char negative_sample [5];
  char negative;
  iu_UnitStringTest_x_iutest_x_OwnStricmp_Test *this_local;
  
  iutest_ar._39_1_ = 0xff;
  iutest_ar._36_1_ = 0;
  iutest_ar.m_result = true;
  iutest_ar._33_3_ = 0xff6161;
  iutest::detail::AlwaysZero();
  local_44[0] = '\0';
  local_44[1] = '\0';
  local_44[2] = '\0';
  local_44[3] = '\0';
  local_48 = iutest::detail::wrapper::iu_stricmp("AAA","aaa");
  val2 = (int *)&iutest_type_traits::enabler_t<void>::value;
  iutest::internal::backward::EqHelper<true>::Compare<int,int>
            ((AssertionResult *)local_40,(EqHelper<true> *)0x1c9d22,
             "::iutest::detail::wrapper::iu_stricmp(\"AAA\", \"aaa\")",local_44,&local_48,
             (int *)&iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffff3a8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    memset(&local_1e0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1e0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_40);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_1.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0x24,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_1.m_result,&local_1e0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1e0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  iutest::detail::AlwaysZero();
  local_23c[0] = '\0';
  local_23c[1] = '\0';
  local_23c[2] = '\0';
  local_23c[3] = '\0';
  local_240 = iutest::detail::wrapper::iu_stricmp("AAAa","aaa");
  iutest::internal::CmpHelperLT<int,int>
            ((AssertionResult *)local_238,(internal *)0x1c9d22,
             "::iutest::detail::wrapper::iu_stricmp(\"AAAa\", \"aaa\")",local_23c,&local_240,val2);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar1) {
    memset(&local_3c8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_3c8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_238);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_2.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0x25,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_2.m_result,&local_3c8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_2.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_3c8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  iutest::detail::AlwaysZero();
  local_424[0] = '\0';
  local_424[1] = '\0';
  local_424[2] = '\0';
  local_424[3] = '\0';
  local_428 = iutest::detail::wrapper::iu_stricmp("AAAB","aaaa");
  iutest::internal::CmpHelperLT<int,int>
            ((AssertionResult *)local_420,(internal *)0x1c9d22,
             "::iutest::detail::wrapper::iu_stricmp(\"AAAB\", \"aaaa\")",local_424,&local_428,val2);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
  if (!bVar1) {
    memset(&local_5b0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_5b0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_420);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_3.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0x26,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_3.m_result,&local_5b0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_3.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_5b0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_420);
  iutest::detail::AlwaysZero();
  local_60c[0] = '\0';
  local_60c[1] = '\0';
  local_60c[2] = '\0';
  local_60c[3] = '\0';
  local_610 = iutest::detail::wrapper::iu_stricmp("AAAA","aaab");
  iutest::internal::CmpHelperGT<int,int>
            ((AssertionResult *)local_608,(internal *)0x1c9d22,
             "::iutest::detail::wrapper::iu_stricmp(\"AAAA\", \"aaab\")",local_60c,&local_610,val2);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_608);
  if (!bVar1) {
    memset(&local_798,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_798);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_608);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_4.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0x27,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_4.m_result,&local_798);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_4.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_798);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_608);
  iutest::detail::AlwaysZero();
  local_7f4[0] = '\0';
  local_7f4[1] = '\0';
  local_7f4[2] = '\0';
  local_7f4[3] = '\0';
  local_7f8 = iutest::detail::wrapper::iu_stricmp("AAA",&iutest_ar.m_result);
  iutest::internal::CmpHelperGT<int,int>
            ((AssertionResult *)local_7f0,(internal *)0x1c9d22,
             "::iutest::detail::wrapper::iu_stricmp(\"AAA\", negative_sample)",local_7f4,&local_7f8,
             val2);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7f0);
  if (!bVar1) {
    memset(&local_980,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_980);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_7f0);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_5.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0x28,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_5.m_result,&local_980);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_5.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_980);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_7f0);
  iutest::detail::AlwaysZero();
  local_9dc[0] = '\0';
  local_9dc[1] = '\0';
  local_9dc[2] = '\0';
  local_9dc[3] = '\0';
  local_9e0 = iutest::detail::wrapper::iu_stricmp("AAA","aaaA");
  iutest::internal::CmpHelperGT<int,int>
            ((AssertionResult *)local_9d8,(internal *)0x1c9d22,
             "::iutest::detail::wrapper::iu_stricmp(\"AAA\", \"aaaA\")",local_9dc,&local_9e0,val2);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9d8);
  if (!bVar1) {
    memset(&local_b68,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_b68);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_9d8);
    iutest::AssertionHelper::AssertionHelper
              (&local_b98,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
               ,0x29,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_b98,&local_b68);
    iutest::AssertionHelper::~AssertionHelper(&local_b98);
    iutest::AssertionHelper::Fixed::~Fixed(&local_b68);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_9d8);
  return;
}

Assistant:

IUTEST(UnitStringTest, OwnStricmp)
{
    const char negative = static_cast<char>(-1);
    const char negative_sample[] = { 'a', 'a', 'a', negative, '\0' };
    IUTEST_EXPECT_EQ(0, ::iutest::detail::wrapper::iu_stricmp("AAA", "aaa"));
    IUTEST_EXPECT_LT(0, ::iutest::detail::wrapper::iu_stricmp("AAAa", "aaa"));
    IUTEST_EXPECT_LT(0, ::iutest::detail::wrapper::iu_stricmp("AAAB", "aaaa"));
    IUTEST_EXPECT_GT(0, ::iutest::detail::wrapper::iu_stricmp("AAAA", "aaab"));
    IUTEST_EXPECT_GT(0, ::iutest::detail::wrapper::iu_stricmp("AAA", negative_sample));
    IUTEST_EXPECT_GT(0, ::iutest::detail::wrapper::iu_stricmp("AAA", "aaaA"));
}